

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse_DigitDs_RE2(int i)

{
  int i_local;
  
  Parse3DigitDs(i,Parse3RE2);
  return;
}

Assistant:

void Parse_DigitDs_RE2(int i)         { Parse3DigitDs(i, Parse3RE2); }